

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_to_binary_tree_inc.h
# Opt level: O2

void InitH10(MemoryManager *m,H10 *self,uint8_t *data,BrotliEncoderParams *params,size_t position,
            size_t bytes,int is_last)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  if (self->is_dirty_ != 0) {
    uVar3 = -1 << (data[8] & 0x1f);
    uVar1 = uVar3 + 1;
    uVar4 = (ulong)~uVar3;
    self->window_mask_ = uVar4;
    self->invalid_pos_ = uVar1;
    for (lVar5 = 0; lVar5 != 0x20000; lVar5 = lVar5 + 1) {
      self->buckets_[lVar5] = uVar1;
    }
    uVar4 = uVar4 + 1;
    if ((int)bytes == 0) {
      position = uVar4;
    }
    if (params != (BrotliEncoderParams *)0x0) {
      position = uVar4;
    }
    if (self->forest_size_ < position) {
      BrotliFree(m,self->forest_);
      self->forest_ = (uint32_t *)0x0;
      if ((position & 0x7fffffffffffffff) == 0) {
        puVar2 = (uint32_t *)0x0;
      }
      else {
        puVar2 = (uint32_t *)BrotliAllocate(m,position * 8);
      }
      self->forest_ = puVar2;
      self->forest_size_ = position;
    }
    self->is_dirty_ = 0;
  }
  return;
}

Assistant:

static void FN(Init)(
    MemoryManager* m, HashToBinaryTree* self, const uint8_t* data,
    const BrotliEncoderParams* params, size_t position, size_t bytes,
    BROTLI_BOOL is_last) {
  if (self->is_dirty_) {
    uint32_t invalid_pos;
    size_t num_nodes;
    uint32_t i;
    BROTLI_UNUSED(data);
    self->window_mask_ = (1u << params->lgwin) - 1u;
    invalid_pos = (uint32_t)(0 - self->window_mask_);
    self->invalid_pos_ = invalid_pos;
    for (i = 0; i < BUCKET_SIZE; i++) {
      self->buckets_[i] = invalid_pos;
    }
    num_nodes = (position == 0 && is_last) ? bytes : self->window_mask_ + 1;
    if (num_nodes > self->forest_size_) {
      BROTLI_FREE(m, self->forest_);
      self->forest_ = BROTLI_ALLOC(m, uint32_t, 2 * num_nodes);
      if (BROTLI_IS_OOM(m)) return;
      self->forest_size_ = num_nodes;
    }
    self->is_dirty_ = BROTLI_FALSE;
  }
}